

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_serialize.c
# Opt level: O1

void metacall_serial_impl_serialize_function
               (value v,char *dest,size_t size,char *format,size_t *length)

{
  *length = 0;
  return;
}

Assistant:

void metacall_serial_impl_serialize_function(value v, char *dest, size_t size, const char *format, size_t *length)
{
	/* TODO: Implement function serialization */
	(void)v;
	(void)dest;
	(void)size;
	(void)format;

	*length = 0;
}